

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O0

int format_number(int64_t v,char *p,int s,int maxsize,int strict)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  int64_t in_RDI;
  int in_R8D;
  int64_t limit;
  long local_30;
  int local_1c;
  int local_4;
  
  local_30 = 1L << ((char)in_EDX * '\x03' & 0x3fU);
  if (in_R8D == 0) {
    local_1c = in_EDX;
    if (-1 < in_RDI) {
      for (; local_1c <= in_ECX; local_1c = local_1c + 1) {
        if (in_RDI < local_30) {
          iVar1 = format_octal(in_RDI,in_RSI,local_1c);
          return iVar1;
        }
        local_30 = local_30 << 3;
      }
    }
    local_4 = format_256(in_RDI,in_RSI,in_ECX);
  }
  else {
    local_4 = format_octal(in_RDI,in_RSI,in_EDX);
  }
  return local_4;
}

Assistant:

static int
format_number(int64_t v, char *p, int s, int maxsize, int strict)
{
	int64_t limit;

	limit = ((int64_t)1 << (s*3));

	/* "Strict" only permits octal values with proper termination. */
	if (strict)
		return (format_octal(v, p, s));

	/*
	 * In non-strict mode, we allow the number to overwrite one or
	 * more bytes of the field termination.  Even old tar
	 * implementations should be able to handle this with no
	 * problem.
	 */
	if (v >= 0) {
		while (s <= maxsize) {
			if (v < limit)
				return (format_octal(v, p, s));
			s++;
			limit <<= 3;
		}
	}

	/* Base-256 can handle any number, positive or negative. */
	return (format_256(v, p, maxsize));
}